

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

void __thiscall Jupiter::IRC::Client::disconnect(Client *this,string_view message,bool stayDead)

{
  Socket *this_00;
  char *__n;
  int in_R8D;
  string local_40;
  
  __n = message._M_str;
  this_00 = (this->m_socket)._M_t.
            super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
            super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
            super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl;
  string_printf_abi_cxx11_(&local_40,"QUIT :%.*s\r\n",message._M_len);
  Socket::send(this_00,(int)local_40._M_string_length,local_40._M_dataplus._M_p,(size_t)__n,in_R8D);
  std::__cxx11::string::~string((string *)&local_40);
  disconnect(this,stayDead);
  return;
}

Assistant:

void Jupiter::IRC::Client::disconnect(std::string_view message, bool stayDead)
{
	m_socket->send(string_printf("QUIT :%.*s" ENDL, message.size(), message.data()));
	Jupiter::IRC::Client::disconnect(stayDead);
}